

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

void __thiscall
kratos::Const::Const(Const *this,Generator *generator,int64_t value,uint32_t width,bool is_signed)

{
  Const *pCVar1;
  uint uVar2;
  UserException *pUVar3;
  undefined4 in_register_0000000c;
  undefined7 in_register_00000081;
  bool bVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar5;
  uint64_t unsigned_value;
  uint32_t var_width;
  uint64_t temp;
  ulong uVar6;
  ulong uVar7;
  uint __len;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  undefined1 local_a8 [8];
  string __str;
  string local_70;
  ulong local_50;
  Generator *local_48;
  uint local_3c;
  Const *local_38;
  
  local_50 = CONCAT44(in_register_0000000c,width);
  local_3c = (uint)CONCAT71(in_register_00000081,is_signed);
  uVar6 = -value;
  if (0 < value) {
    uVar6 = value;
  }
  __len = 1;
  if (9 < uVar6) {
    uVar7 = uVar6;
    uVar2 = 4;
    do {
      __len = uVar2;
      if (uVar7 < 100) {
        __len = __len - 2;
        goto LAB_00183579;
      }
      if (uVar7 < 1000) {
        __len = __len - 1;
        goto LAB_00183579;
      }
      if (uVar7 < 10000) goto LAB_00183579;
      bVar4 = 99999 < uVar7;
      uVar7 = uVar7 / 10000;
      uVar2 = __len + 4;
    } while (bVar4);
    __len = __len + 1;
  }
LAB_00183579:
  local_a8 = (undefined1  [8])&__str._M_string_length;
  local_48 = generator;
  local_38 = this;
  std::__cxx11::string::_M_construct((ulong)local_a8,(char)__len - (char)(value >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)((long)local_a8 + -(value >> 0x3f)),__len,uVar6);
  pCVar1 = local_38;
  uVar6 = local_50;
  aVar5._0_4_ = local_3c & 0xff;
  aVar5._4_4_ = 0;
  var_width = (uint32_t)local_50;
  bVar4 = SUB41(local_3c,0);
  Var::Var(&local_38->super_Var,local_48,(string *)local_a8,var_width,1,bVar4,ConstValue);
  if (local_a8 != (undefined1  [8])&__str._M_string_length) {
    operator_delete((void *)local_a8,__str._M_string_length + 1);
  }
  (pCVar1->super_Var).super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_002a5928;
  pCVar1->value_ = 0;
  (pCVar1->hex_value_)._M_dataplus._M_p = (pointer)&(pCVar1->hex_value_).field_2;
  (pCVar1->hex_value_)._M_string_length = 0;
  (pCVar1->hex_value_).field_2._M_local_buf[0] = '\0';
  pCVar1->num_bits_ = 0;
  pCVar1->negative_ = false;
  if (bVar4 == false) {
    if (var_width < 0x40 && (ulong)value >> ((byte)uVar6 & 0x3f) != 0) {
LAB_0018368e:
      pUVar3 = (UserException *)__cxa_allocate_exception(0x10);
      format_str.size_ = 0x243;
      format_str.data_ = (char *)0x3a;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = aVar5.values_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_a8;
      local_a8 = (undefined1  [8])value;
      __str._M_string_length = ~(-1L << ((byte)(uVar6 & 0xffffffff) & 0x3f));
      __str.field_2._8_8_ = uVar6 & 0xffffffff;
      fmt::v7::detail::vformat_abi_cxx11_
                (&local_70,(detail *)"{0} is larger than the maximum value ({1}) given width {2}",
                 format_str,args);
      UserException::UserException(pUVar3,&local_70);
      __cxa_throw(pUVar3,&UserException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    uVar7 = -1L << ((byte)uVar6 - 1 & 0x3f);
    if ((long)~uVar7 < value || value < (long)uVar7) {
      if (value < (long)uVar7) {
        pUVar3 = (UserException *)__cxa_allocate_exception(0x10);
        __str.field_2._8_8_ = uVar6 & 0xffffffff;
        format_str_00.size_ = 0x233;
        format_str_00.data_ = (char *)0x3b;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.values_ = aVar5.values_;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)local_a8;
        local_a8 = (undefined1  [8])value;
        __str._M_string_length = uVar7;
        fmt::v7::detail::vformat_abi_cxx11_
                  (&local_70,(detail *)"{0} is smaller than the minimum value ({1}) given width {2}"
                   ,format_str_00,args_00);
        UserException::UserException(pUVar3,&local_70);
        __cxa_throw(pUVar3,&UserException::typeinfo,std::runtime_error::~runtime_error);
      }
      if (var_width < 0x41) goto LAB_0018368e;
    }
  }
  pCVar1->value_ = value;
  return;
}

Assistant:

Const::Const(Generator *generator, int64_t value, uint32_t width, bool is_signed)
    : Var(generator, std::to_string(value), width, 1, is_signed, VarType::ConstValue), value_() {
    // need to deal with the signed value
    auto is_legal = Const::is_legal(value, width, is_signed);
    if (is_legal == ConstantLegal::Small) {
        uint64_t temp = (~0ull) << (width - 1);
        int64_t min = 0;
        std::memcpy(&min, &temp, sizeof(min));
        throw UserException(::format("{0} is smaller than the minimum value ({1}) given width {2}",
                                     value, min, width));
    } else if (is_legal == ConstantLegal::Big && width <= 64) {
        uint64_t max = (1ull << width) - 1;
        uint64_t unsigned_value;
        std::memcpy(&unsigned_value, &value, sizeof(unsigned_value));
        throw UserException(::format("{0} is larger than the maximum value ({1}) given width {2}",
                                     value, max, width));
    }
    value_ = value;
}